

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O1

pdu_end_of_data_v1_v2 * end_cache_response(uint8_t version,uint16_t session_id,uint32_t sn)

{
  char *pcVar1;
  pdu_end_of_data_v1_v2 *ppVar2;
  size_t sVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  char *pcVar6;
  undefined7 in_register_00000039;
  long in_FS_OFFSET;
  
  ppVar2 = *(pdu_end_of_data_v1_v2 **)(in_FS_OFFSET + 0x28);
  pcVar6 = (char *)lrtr_realloc(data,data_size + 0x18);
  sVar3 = data_size;
  data = pcVar6;
  if (pcVar6 == (char *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0xa7,
                  "struct pdu_end_of_data_v1_v2 *end_cache_response(uint8_t, uint16_t, uint32_t)");
  }
  pcVar1 = pcVar6 + data_size;
  pcVar1[0] = '\x02';
  pcVar1[1] = '\a';
  uVar4 = lrtr_convert_short(TO_HOST_HOST_BYTE_ORDER,0);
  *(uint16_t *)(pcVar6 + sVar3 + 2) = uVar4;
  uVar5 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,0x18);
  *(uint32_t *)(pcVar6 + sVar3 + 4) = uVar5;
  uVar5 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,(uint32_t)CONCAT71(in_register_00000039,version)
                           );
  *(uint32_t *)(pcVar6 + sVar3 + 8) = uVar5;
  uVar5 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,1);
  *(uint32_t *)(pcVar6 + sVar3 + 0xc) = uVar5;
  uVar5 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,1);
  *(uint32_t *)(pcVar6 + sVar3 + 0x10) = uVar5;
  uVar5 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,600);
  *(uint32_t *)(pcVar6 + sVar3 + 0x14) = uVar5;
  data_size = data_size + 0x18;
  if (*(pdu_end_of_data_v1_v2 **)(in_FS_OFFSET + 0x28) == ppVar2) {
    return *(pdu_end_of_data_v1_v2 **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static struct pdu_end_of_data_v1_v2 *end_cache_response(uint8_t version, uint16_t session_id, uint32_t sn)
{
	data = lrtr_realloc(data, data_size + sizeof(struct pdu_end_of_data_v1_v2));
	assert(data);

	struct pdu_end_of_data_v1_v2 *eod = (struct pdu_end_of_data_v1_v2 *)(data + data_size);

	eod->ver = version;
	eod->type = EOD;
	eod->session_id = BYTES16(session_id);
	eod->len = BYTES32(24);
	eod->sn = BYTES32(sn);
	eod->refresh_interval = BYTES32(RTR_REFRESH_MIN);
	eod->retry_interval = BYTES32(RTR_RETRY_MIN);
	eod->expire_interval = BYTES32(RTR_EXPIRATION_MIN);

	data_size += sizeof(struct pdu_end_of_data_v1_v2);

	return eod;
}